

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

Fad<double> * __thiscall TPZMatrix<Fad<double>_>::GetRandomVal(TPZMatrix<Fad<double>_> *this)

{
  int iVar1;
  Fad<double> *in_RDI;
  double *x;
  value_type_conflict1 upper_bound;
  value_type_conflict1 lower_bound;
  Fad<double> *a_random;
  Fad<double> *this_00;
  uint in_stack_ffffffffffffffd0;
  uint uVar2;
  undefined4 in_stack_ffffffffffffffd4;
  
  this_00 = in_RDI;
  if ((TPZMatrix<Fad<double>>::GetRandomVal()::unif == '\0') &&
     (iVar1 = __cxa_guard_acquire(&TPZMatrix<Fad<double>>::GetRandomVal()::unif), iVar1 != 0)) {
    std::uniform_real_distribution<double>::uniform_real_distribution
              ((uniform_real_distribution<double> *)this_00,(double)in_RDI,9.93560727284336e-317);
    __cxa_guard_release(&TPZMatrix<Fad<double>>::GetRandomVal()::unif);
  }
  if ((TPZMatrix<Fad<double>>::GetRandomVal()::re == '\0') &&
     (iVar1 = __cxa_guard_acquire(&TPZMatrix<Fad<double>>::GetRandomVal()::re), iVar1 != 0)) {
    std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
    linear_congruential_engine
              ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)0x132da7c);
    __cxa_guard_release(&TPZMatrix<Fad<double>>::GetRandomVal()::re);
  }
  uVar2 = in_stack_ffffffffffffffd0 & 0xffffff;
  x = (double *)
      std::uniform_real_distribution<double>::operator()
                ((uniform_real_distribution<double> *)this_00,
                 (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)in_RDI);
  Fad<double>::Fad<double,_nullptr>((Fad<double> *)CONCAT44(in_stack_ffffffffffffffd4,uVar2),x);
  return this_00;
}

Assistant:

TVar TPZMatrix<TVar>::GetRandomVal() const{

    if constexpr (std::is_integral_v<TVar> ||
                  std::is_same_v<TVar,TPZFlopCounter>){
        return  ((TVar) rand())/((TVar)RAND_MAX);
    }
    
    else if constexpr (is_fad<TVar>::value){
      constexpr typename TVar::value_type lower_bound = 0;
      constexpr typename TVar::value_type upper_bound = 1;
      static std::uniform_real_distribution<typename TVar::value_type>
        unif(lower_bound,upper_bound);
      static std::default_random_engine re;
      TVar a_random = (TVar)unif(re);
      if constexpr (is_complex<TVar>::value){
        a_random+= (TVar)1i * (TVar)unif(re);
      }
      return a_random;
    }else{
        constexpr RTVar lower_bound = 0;
        constexpr RTVar upper_bound = 1;
        static std::uniform_real_distribution<RTVar> unif(lower_bound,upper_bound);
        static std::default_random_engine re;
        TVar a_random = (TVar)unif(re);
        if constexpr (is_complex<TVar>::value){
            a_random+= (TVar)1i * (TVar)unif(re);
        }
        return a_random;
    }
}